

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

int traverseephemeron(global_State *g,Table *h)

{
  byte bVar1;
  uint uVar2;
  Node *pNVar3;
  GCObject *pGVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  Node *pNVar10;
  int local_34;
  
  bVar1 = h->lsizenode;
  pNVar3 = h->node;
  if (h->sizearray == 0) {
    local_34 = 0;
  }
  else {
    uVar8 = 0;
    lVar9 = 8;
    local_34 = 0;
    do {
      if (((*(byte *)((long)&h->array->value_ + lVar9) & 0x40) != 0) &&
         (pGVar4 = *(GCObject **)((long)h->array + lVar9 + -8), (pGVar4->marked & 3) != 0)) {
        reallymarkobject(g,pGVar4);
        local_34 = 1;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < h->sizearray);
  }
  pNVar10 = h->node;
  bVar7 = 0;
  if (pNVar10 < pNVar3 + (1 << (bVar1 & 0x1f))) {
    bVar6 = bVar7;
    bVar7 = 0;
    do {
      if ((pNVar10->i_val).tt_ == 0) {
        if (((undefined1  [16])((undefined1  [16])pNVar10->i_key & (undefined1  [16])0x40) !=
             (undefined1  [16])0x0) && ((((pNVar10->i_key).nk.value_.gc)->marked & 3) != 0)) {
          (pNVar10->i_key).nk.tt_ = 10;
        }
      }
      else {
        iVar5 = iscleared(g,&(pNVar10->i_key).tvk);
        uVar2 = (pNVar10->i_val).tt_;
        if (iVar5 == 0) {
          if (((uVar2 & 0x40) != 0) &&
             (pGVar4 = (pNVar10->i_val).value_.gc, (pGVar4->marked & 3) != 0)) {
            reallymarkobject(g,pGVar4);
            local_34 = 1;
          }
        }
        else {
          bVar7 = 1;
          if (((uVar2 & 0x40) != 0) && ((((pNVar10->i_val).value_.gc)->marked & 3) != 0)) {
            bVar6 = 1;
          }
        }
      }
      pNVar10 = pNVar10 + 1;
    } while (pNVar10 < pNVar3 + (1 << (bVar1 & 0x1f)));
  }
  else {
    bVar6 = 0;
  }
  if ((bVar7 != 0 || bVar6 != 0) || g->gcstate == '\0') {
    lVar9 = 0x78;
    if (g->gcstate != '\0') {
      lVar9 = (ulong)(bVar6 ^ 1) * 8 + 0x88;
    }
    h->gclist = *(GCObject **)((long)&g->frealloc + lVar9);
    *(Table **)((long)&g->frealloc + lVar9) = h;
  }
  return local_34;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h) {
  int marked = 0;  /* true if an object is marked in this traversal */
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  Node *n, *limit = gnodelast(h);
  unsigned int i;
  /* traverse array part */
  for (i = 0; i < h->sizearray; i++) {
    if (valiswhite(&h->array[i])) {
      marked = 1;
      reallymarkobject(g, gcvalue(&h->array[i]));
    }
  }
  /* traverse hash part */
  for (n = gnode(h, 0); n < limit; n++) {
    checkdeadkey(n);
    if (ttisnil(gval(n)))  /* entry is empty? */
      removeentry(n);  /* remove it */
    else if (iscleared(g, gkey(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  return marked;
}